

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_IndexSpaceI.H
# Opt level: O2

void __thiscall
amrex::EB2::
IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>
::IndexSpaceImp(IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>
                *this,GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>
                      *gshop,Geometry *geom,int required_coarsening_level,int max_coarsening_level,
               int ngrow,bool build_coarse_level_by_coarsening,bool extend_domain_face,
               int num_coarsen_opt)

{
  pointer pGVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>_>_>
  *pvVar5;
  vector<amrex::Box,_std::allocator<amrex::Box>_> *pvVar6;
  vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *pvVar7;
  vector<int,_std::allocator<int>_> *pvVar8;
  bool bVar9;
  int iVar10;
  long lVar11;
  bool extend_domain_face_local;
  int local_19c;
  int ng;
  int ngrow_finest;
  vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>>>>
  *local_190;
  Box result;
  string local_138;
  string local_118;
  Geometry cgeom;
  
  iVar10 = num_coarsen_opt;
  extend_domain_face_local = extend_domain_face;
  (this->super_IndexSpace)._vptr_IndexSpace = (_func_int **)&PTR__IndexSpaceImp_007d3180;
  GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>
  ::GeometryShop(&this->m_gshop,gshop);
  this->m_build_coarse_level_by_coarsening = build_coarse_level_by_coarsening;
  this->m_extend_domain_face = extend_domain_face;
  this->m_num_coarsen_opt = iVar10;
  local_190 = (vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>>>>
               *)&this->m_gslevel;
  pvVar5 = &(this->m_gslevel).
            super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>_>_>
  ;
  (pvVar5->
  super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar5->
  super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->m_gslevel).
    super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>_>_>
    .
    super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  pvVar7 = &(this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  (pvVar7->super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar7->super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar6 = &(this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>;
  (pvVar6->super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar6->super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (undefined1  [16])0x0;
  pvVar8 = &(this->m_ngrow).super_vector<int,_std::allocator<int>_>;
  (pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  (pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (0x1e < (uint)required_coarsening_level) {
    Assert_host("required_coarsening_level >= 0 && required_coarsening_level <= 30",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/EB/AMReX_EB2_IndexSpaceI.H"
                ,0xe,(char *)0x0);
  }
  if (max_coarsening_level < required_coarsening_level) {
    max_coarsening_level = required_coarsening_level;
  }
  if (ngrow < 1) {
    ngrow = 0;
  }
  iVar10 = 0;
  if (0 < required_coarsening_level) {
    iVar10 = required_coarsening_level;
  }
  while (iVar10 != 0) {
    ngrow = ngrow * 2;
    iVar10 = iVar10 + -1;
  }
  iVar10 = 0x1e;
  if (max_coarsening_level < 0x1e) {
    iVar10 = max_coarsening_level;
  }
  ngrow_finest = ngrow;
  std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::push_back
            (&(this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,geom);
  std::vector<amrex::Box,_std::allocator<amrex::Box>_>::push_back
            (&(this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>,&geom->domain);
  std::vector<int,_std::allocator<int>_>::push_back
            (&(this->m_ngrow).super_vector<int,_std::allocator<int>_>,&ngrow_finest);
  std::
  vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>_>_>
  ::reserve((vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>_>_>
             *)local_190,(long)(iVar10 + 1));
  cgeom.super_CoordSys._0_8_ = this;
  std::
  vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>>>>
  ::
  emplace_back<amrex::EB2::IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>>*,amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>const&,amrex::Geometry_const&,int&,int&,bool&,int&>
            (local_190,
             (IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>
              **)&cgeom,gshop,geom,&EB2::max_grid_size,&ngrow_finest,&extend_domain_face_local,
             &num_coarsen_opt);
  local_19c = 1;
  do {
    if (iVar10 < local_19c) {
      return;
    }
    bVar9 = Box::coarsenable(&(this->m_geom).
                              super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                              super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                              _M_impl.super__Vector_impl_data._M_finish[-1].domain,2,2);
    if (!bVar9) {
      if (required_coarsening_level < local_19c) {
        return;
      }
      std::__cxx11::to_string(&local_138,local_19c);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cgeom,
                     "IndexSpaceImp: domain is not coarsenable at level ",&local_138);
      Abort((string *)&cgeom);
      std::__cxx11::string::~string((string *)&cgeom);
      std::__cxx11::string::~string((string *)&local_138);
    }
    ng = 0;
    if (local_19c <= required_coarsening_level) {
      ng = (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
           [-1] / 2;
    }
    pGVar1 = (this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
             super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar2 = *(undefined8 *)pGVar1[-1].domain.smallend.vect;
    uVar3 = *(undefined8 *)(pGVar1[-1].domain.smallend.vect + 2);
    uVar4 = *(undefined8 *)(pGVar1[-1].domain.bigend.vect + 2);
    result.bigend.vect[2] = (int)uVar4;
    result.btype.itype = SUB84(uVar4,4);
    result.smallend.vect[2] = (int)uVar3;
    result.smallend.vect[0] = (int)uVar2 >> 1;
    result.smallend.vect[1] = (int)((long)uVar2 >> 0x21);
    result.smallend.vect[2] = result.smallend.vect[2] >> 1;
    local_138._M_dataplus._M_p = &DAT_200000002;
    local_138._M_string_length._0_4_ = 2;
    result.btype.itype = SUB84(uVar4,4);
    result.bigend.vect[2] = (int)uVar4;
    result.bigend.vect[2] = result.bigend.vect[2] >> 1;
    result.bigend.vect[0] = (int)((long)uVar3 >> 0x21);
    result.bigend.vect[1] = (int)((long)*(undefined8 *)pGVar1[-1].domain.bigend.vect >> 0x21);
    if (result.btype.itype != 0) {
      cgeom.super_CoordSys.c_sys = cartesian;
      cgeom.super_CoordSys._4_4_ = 0;
      cgeom.super_CoordSys.offset[0]._0_4_ = 0;
      for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
        if (((result.btype.itype >> ((uint)lVar11 & 0x1f) & 1) != 0) &&
           (result.bigend.vect[lVar11] % *(int *)((long)&local_138._M_dataplus._M_p + lVar11 * 4) !=
            0)) {
          *(undefined4 *)((long)cgeom.super_CoordSys.offset + lVar11 * 4 + -8) = 1;
        }
      }
      result.bigend.vect[0] = cgeom.super_CoordSys.c_sys + result.bigend.vect[0];
      result.bigend.vect[1] = cgeom.super_CoordSys._4_4_ + result.bigend.vect[1];
      result.bigend.vect[2] = result.bigend.vect[2] + cgeom.super_CoordSys.offset[0]._0_4_;
    }
    amrex::coarsen(&cgeom,pGVar1 + -1,2);
    local_138._M_dataplus._M_p = (pointer)this;
    std::
    vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>>>>
    ::
    emplace_back<amrex::EB2::IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>>*,int&,int&,int&,amrex::Geometry&,amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>>&>
              (local_190,
               (IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>
                **)&local_138,&local_19c,&EB2::max_grid_size,&ng,&cgeom,
               (this->m_gslevel).
               super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>_>_>
               .
               super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + (long)local_19c + -1);
    if ((this->m_gslevel).
        super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>_>_>
        .
        super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].super_Level.m_ok == false) {
      std::
      vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>_>_>
      ::pop_back((vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>_>_>
                  *)local_190);
      if (required_coarsening_level < local_19c) {
        return;
      }
      if (build_coarse_level_by_coarsening) {
        std::__cxx11::to_string(&local_118,local_19c);
        std::operator+(&local_138,"Failed to build required coarse EB level ",&local_118);
        Abort(&local_138);
        std::__cxx11::string::~string((string *)&local_138);
        std::__cxx11::string::~string((string *)&local_118);
      }
      else {
        local_118._M_dataplus._M_p._0_4_ = num_coarsen_opt - local_19c;
        local_138._M_dataplus._M_p = (pointer)this;
        std::
        vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>>>>
        ::
        emplace_back<amrex::EB2::IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>>*,amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>const&,amrex::Geometry&,int&,int&,bool&,int>
                  (local_190,
                   (IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>
                    **)&local_138,gshop,&cgeom,&EB2::max_grid_size,&ng,&extend_domain_face_local,
                   (int *)&local_118);
      }
    }
    std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::push_back
              (&(this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,
               &cgeom);
    std::vector<amrex::Box,_std::allocator<amrex::Box>_>::push_back
              (&(this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>,&result);
    std::vector<int,_std::allocator<int>_>::push_back
              (&(this->m_ngrow).super_vector<int,_std::allocator<int>_>,&ng);
    local_19c = local_19c + 1;
  } while( true );
}

Assistant:

IndexSpaceImp<G>::IndexSpaceImp (const G& gshop, const Geometry& geom,
                                 int required_coarsening_level,
                                 int max_coarsening_level,
                                 int ngrow, bool build_coarse_level_by_coarsening,
                                 bool extend_domain_face, int num_coarsen_opt)
    : m_gshop(gshop),
      m_build_coarse_level_by_coarsening(build_coarse_level_by_coarsening),
      m_extend_domain_face(extend_domain_face),
      m_num_coarsen_opt(num_coarsen_opt)
{
    // build finest level (i.e., level 0) first
    AMREX_ALWAYS_ASSERT(required_coarsening_level >= 0 && required_coarsening_level <= 30);
    max_coarsening_level = std::max(required_coarsening_level,max_coarsening_level);
    max_coarsening_level = std::min(30,max_coarsening_level);

    int ngrow_finest = std::max(ngrow,0);
    for (int i = 1; i <= required_coarsening_level; ++i) {
        ngrow_finest *= 2;
    }

    m_geom.push_back(geom);
    m_domain.push_back(geom.Domain());
    m_ngrow.push_back(ngrow_finest);
    m_gslevel.reserve(max_coarsening_level+1);
    m_gslevel.emplace_back(this, gshop, geom, EB2::max_grid_size, ngrow_finest, extend_domain_face,
                           num_coarsen_opt);

    for (int ilev = 1; ilev <= max_coarsening_level; ++ilev)
    {
        bool coarsenable = m_geom.back().Domain().coarsenable(2,2);
        if (!coarsenable) {
            if (ilev <= required_coarsening_level) {
                amrex::Abort("IndexSpaceImp: domain is not coarsenable at level "+std::to_string(ilev));
            } else {
                break;
            }
        }

        int ng = (ilev > required_coarsening_level) ? 0 : m_ngrow.back()/2;

        Box cdomain = amrex::coarsen(m_geom.back().Domain(),2);
        Geometry cgeom = amrex::coarsen(m_geom.back(),2);
        m_gslevel.emplace_back(this, ilev, EB2::max_grid_size, ng, cgeom, m_gslevel[ilev-1]);
        if (!m_gslevel.back().isOK()) {
            m_gslevel.pop_back();
            if (ilev <= required_coarsening_level) {
                if (build_coarse_level_by_coarsening) {
                    amrex::Abort("Failed to build required coarse EB level "+std::to_string(ilev));
                } else {
                    m_gslevel.emplace_back(this, gshop, cgeom, EB2::max_grid_size, ng, extend_domain_face,
                                           num_coarsen_opt-ilev);
                }
            } else {
                break;
            }
        }
        m_geom.push_back(cgeom);
        m_domain.push_back(cdomain);
        m_ngrow.push_back(ng);
    }
}